

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

StatementSyntax * __thiscall
slang::parsing::Parser::parseStatement(Parser *this,bool allowEmpty,bool allowSuperNew)

{
  bool bVar1;
  TokenKind TVar2;
  TokenKind endKind;
  ulong uVar3;
  NamedLabelSyntax *label;
  TimingControlSyntax *timingControl;
  StatementSyntax *pSVar4;
  ForLoopStatementSyntax *pFVar5;
  undefined8 uVar6;
  ExpressionSyntax *expr;
  SourceLocation SVar7;
  Diagnostic *this_00;
  uint uVar8;
  Info *pIVar9;
  __extent_storage<18446744073709551615UL> _Var10;
  SyntaxKind SVar11;
  uint32_t offset;
  Token TVar12;
  Token colon;
  AttrList attributes;
  string_view sVar13;
  Token foreverKeyword;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_c0;
  Info *local_88;
  Token local_80;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  uVar3 = this->recursionDepth + 1;
  this->recursionDepth = uVar3;
  if ((this->parseOptions).maxRecursionDepth < uVar3) {
    handleTooDeep(this);
  }
  TVar12 = ParserBase::peek(&this->super_ParserBase);
  if ((TVar12.kind == Identifier) &&
     (TVar12 = ParserBase::peek(&this->super_ParserBase,1), TVar12.kind == Colon)) {
    TVar12 = ParserBase::consume(&this->super_ParserBase);
    colon = ParserBase::consume(&this->super_ParserBase);
    label = slang::syntax::SyntaxFactory::namedLabel(&this->factory,TVar12,colon);
  }
  else {
    label = (NamedLabelSyntax *)0x0;
  }
  attributes = parseAttributes(this);
  _Var10 = attributes._M_extent._M_extent_value;
  TVar12 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar12.kind;
  local_c0.super_SyntaxListBase.childCount = _Var10._M_extent_value;
  local_c0.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> = attributes
  ;
  if (TVar2 < ForKeyword) {
    if (TVar2 < AssertKeyword) {
      uVar8 = TVar2 - 0x26;
      if (uVar8 < 0x32) {
        if ((0x2000000000300U >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
          timingControl = parseTimingControl(this,false);
          local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
          local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
          local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
          local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c8c880;
          pSVar4 = parseStatement(this,true,false);
          pFVar5 = (ForLoopStatementSyntax *)
                   slang::syntax::SyntaxFactory::timingControlStatement
                             (&this->factory,label,&local_c0,timingControl,pSVar4);
          goto LAB_00680978;
        }
        if ((3UL >> ((ulong)uVar8 & 0x3f) & 1) != 0) {
          pFVar5 = (ForLoopStatementSyntax *)parseEventTriggerStatement(this,label,attributes);
          goto LAB_00680978;
        }
      }
      if (TVar2 == Identifier) {
        offset = 1;
        TVar12 = ParserBase::peek(&this->super_ParserBase,1);
        if (TVar12.kind == DoubleColon) {
          TVar12 = ParserBase::peek(&this->super_ParserBase,2);
          offset = (uint)(TVar12.kind == Identifier) * 2 + 1;
        }
        TVar12 = ParserBase::peek(&this->super_ParserBase,offset);
        if ((TVar12.kind == Identifier) &&
           (TVar12 = ParserBase::peek(&this->super_ParserBase,offset + 1),
           TVar12.kind == OpenParenthesis)) {
          pFVar5 = (ForLoopStatementSyntax *)parseCheckerStatement(this,label,attributes);
          goto LAB_00680978;
        }
      }
      else if (TVar2 == Semicolon) {
        if (label == (NamedLabelSyntax *)0x0) {
          if (!allowEmpty) {
            local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
            SVar7 = Token::location((Token *)&local_c0);
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x510005,SVar7);
          }
        }
        else {
          local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
          SVar7 = Token::location((Token *)&local_c0);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x860005,SVar7);
        }
        local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
        local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c8c880;
        TVar12 = ParserBase::consume(&this->super_ParserBase);
        pFVar5 = (ForLoopStatementSyntax *)
                 slang::syntax::SyntaxFactory::emptyStatement(&this->factory,label,&local_c0,TVar12)
        ;
        goto LAB_00680978;
      }
      goto switchD_0068015f_caseD_67;
    }
    switch(TVar2) {
    case AssertKeyword:
    case AssumeKeyword:
switchD_0068015f_caseD_64:
      pFVar5 = (ForLoopStatementSyntax *)parseAssertionStatement(this,label,attributes);
      goto LAB_00680978;
    case AssignKeyword:
      SVar11 = ProceduralAssignStatement;
LAB_00680608:
      pFVar5 = (ForLoopStatementSyntax *)
               parseProceduralAssignStatement(this,label,attributes,SVar11);
      goto LAB_00680978;
    case AutomaticKeyword:
    case BeforeKeyword:
    case BindKeyword:
    case BinsKeyword:
    case BinsOfKeyword:
    case BitKeyword:
    case BufKeyword:
    case BufIf0Keyword:
    case BufIf1Keyword:
    case ByteKeyword:
      goto switchD_0068015f_caseD_67;
    case BeginKeyword:
      endKind = EndKeyword;
      SVar11 = SequentialBlockStatement;
LAB_006805e9:
      pFVar5 = (ForLoopStatementSyntax *)parseBlock(this,SVar11,endKind,label,attributes);
      goto LAB_00680978;
    case BreakKeyword:
switchD_0068015f_caseD_6e:
      pFVar5 = (ForLoopStatementSyntax *)parseJumpStatement(this,label,attributes);
      goto LAB_00680978;
    case CaseKeyword:
    case CaseXKeyword:
    case CaseZKeyword:
      Token::Token(&local_60);
      local_70 = ParserBase::consume(&this->super_ParserBase);
      pFVar5 = (ForLoopStatementSyntax *)parseCaseStatement(this,label,attributes,local_60,local_70)
      ;
      goto LAB_00680978;
    }
    switch(TVar2) {
    case ContinueKeyword:
      goto switchD_0068015f_caseD_6e;
    case CoverKeyword:
      goto switchD_0068015f_caseD_64;
    case CoverGroupKeyword:
    case CoverPointKeyword:
    case CrossKeyword:
    case DefaultKeyword:
    case DefParamKeyword:
    case DesignKeyword:
    case DistKeyword:
      goto switchD_0068015f_caseD_67;
    case DeassignKeyword:
      SVar11 = ProceduralDeassignStatement;
LAB_006807f2:
      pFVar5 = (ForLoopStatementSyntax *)
               parseProceduralDeassignStatement(this,label,attributes,SVar11);
      break;
    case DisableKeyword:
      pFVar5 = (ForLoopStatementSyntax *)parseDisableStatement(this,label,attributes);
      break;
    case DoKeyword:
      pFVar5 = (ForLoopStatementSyntax *)parseDoWhileStatement(this,label,attributes);
      break;
    default:
      if (TVar2 == ExpectKeyword) goto switchD_006801e0_caseD_105;
      goto switchD_0068015f_caseD_67;
    }
  }
  else {
    if (TVar2 < UniqueKeyword) {
      uVar8 = TVar2 - 0xaa;
      if (uVar8 < 0xd) {
        pIVar9 = (Info *)((long)&switchD_006802ef::switchdataD_00a377f0 +
                         (long)(int)(&switchD_006802ef::switchdataD_00a377f0)[uVar8]);
        switch((uint)TVar2) {
        case 0xaa:
          pFVar5 = parseForLoopStatement(this,label,attributes);
          break;
        case 0xab:
          SVar11 = ProceduralForceStatement;
          goto LAB_00680608;
        case 0xac:
          pFVar5 = (ForLoopStatementSyntax *)parseForeachLoopStatement(this,label,attributes);
          break;
        case 0xad:
          TVar12 = ParserBase::consume(&this->super_ParserBase);
          local_88 = TVar12.info;
          uVar6 = TVar12._0_8_;
          pSVar4 = parseStatement(this,true,false);
          TVar12.info = pIVar9;
          TVar12.kind = (short)uVar6;
          TVar12._2_1_ = (char)((ulong)uVar6 >> 0x10);
          TVar12.numFlags.raw = (char)((ulong)uVar6 >> 0x18);
          TVar12.rawLen = (int)((ulong)uVar6 >> 0x20);
          sVar13._M_str = "forever loop";
          sVar13._M_len = 0xc;
          checkEmptyBody(this,&pSVar4->super_SyntaxNode,TVar12,sVar13);
          local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
          local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
          local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
          local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c8c880;
          foreverKeyword.info = local_88;
          foreverKeyword.kind = (short)uVar6;
          foreverKeyword._2_1_ = (char)((ulong)uVar6 >> 0x10);
          foreverKeyword.numFlags.raw = (char)((ulong)uVar6 >> 0x18);
          foreverKeyword.rawLen = (int)((ulong)uVar6 >> 0x20);
          pFVar5 = (ForLoopStatementSyntax *)
                   slang::syntax::SyntaxFactory::foreverStatement
                             (&this->factory,label,&local_c0,foreverKeyword,pSVar4);
          break;
        case 0xae:
          endKind = JoinKeyword;
          SVar11 = ParallelBlockStatement;
          goto LAB_006805e9;
        default:
          goto switchD_0068015f_caseD_67;
        case 0xb6:
          Token::Token(&local_80);
LAB_006805ac:
          pFVar5 = (ForLoopStatementSyntax *)
                   parseConditionalStatement(this,label,attributes,local_80);
        }
        goto LAB_00680978;
      }
      switch(TVar2) {
      case RandCaseKeyword:
        pFVar5 = (ForLoopStatementSyntax *)parseRandCaseStatement(this,label,attributes);
        break;
      case RandSequenceKeyword:
        pFVar5 = (ForLoopStatementSyntax *)parseRandSequenceStatement(this,label,attributes);
        break;
      case RcmosKeyword:
      case RealKeyword:
      case RealTimeKeyword:
      case RefKeyword:
      case RegKeyword:
      case RejectOnKeyword:
        goto switchD_0068015f_caseD_67;
      case ReleaseKeyword:
        SVar11 = ProceduralReleaseStatement;
        goto LAB_006807f2;
      case RepeatKeyword:
        goto switchD_006801e0_caseD_104;
      case RestrictKeyword:
switchD_006801e0_caseD_105:
        pFVar5 = (ForLoopStatementSyntax *)parseConcurrentAssertion(this,label,attributes);
        break;
      case ReturnKeyword:
        pFVar5 = (ForLoopStatementSyntax *)parseReturnStatement(this,label,attributes);
        break;
      default:
        if (TVar2 == PriorityKeyword) goto LAB_00680434;
        goto switchD_0068015f_caseD_67;
      }
      goto LAB_00680978;
    }
    switch(TVar2) {
    case VoidKeyword:
      pFVar5 = (ForLoopStatementSyntax *)parseVoidCallStatement(this,label,attributes);
      break;
    case WaitKeyword:
      pFVar5 = (ForLoopStatementSyntax *)parseWaitStatement(this,label,attributes);
      break;
    case WaitOrderKeyword:
      pFVar5 = (ForLoopStatementSyntax *)parseWaitOrderStatement(this,label,attributes);
      break;
    case WhileKeyword:
switchD_006801e0_caseD_104:
      pFVar5 = (ForLoopStatementSyntax *)parseLoopStatement(this,label,attributes);
      break;
    default:
      if (TVar2 - 0x13b < 2) {
LAB_00680434:
        TVar12 = ParserBase::peek(&this->super_ParserBase,1);
        if (TVar12.kind - 0x73 < 3) {
          TVar12 = ParserBase::consume(&this->super_ParserBase);
          local_50 = ParserBase::consume(&this->super_ParserBase);
          pFVar5 = (ForLoopStatementSyntax *)
                   parseCaseStatement(this,label,attributes,TVar12,local_50);
          break;
        }
        if (TVar12.kind != IfKeyword) {
          local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase,1);
          SVar7 = Token::location((Token *)&local_c0);
          this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x420005,SVar7);
          TVar12 = ParserBase::peek(&this->super_ParserBase);
          sVar13 = LexerFacts::getTokenKindText(TVar12.kind);
          Diagnostic::operator<<(this_00,sVar13);
          ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
          local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
          local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
          local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
          local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c8c880;
          local_40 = ParserBase::peek(&this->super_ParserBase);
          SVar7 = Token::location(&local_40);
          TVar12 = ParserBase::missingToken(&this->super_ParserBase,Semicolon,SVar7);
          pFVar5 = (ForLoopStatementSyntax *)
                   slang::syntax::SyntaxFactory::emptyStatement
                             (&this->factory,label,&local_c0,TVar12);
          break;
        }
        local_80 = ParserBase::consume(&this->super_ParserBase);
        goto LAB_006805ac;
      }
      if ((((TVar2 == UnitSystemName) &&
           (TVar12 = ParserBase::peek(&this->super_ParserBase,1), TVar12.kind == DoubleColon)) &&
          (TVar12 = ParserBase::peek(&this->super_ParserBase,2), TVar12.kind == Identifier)) &&
         ((TVar12 = ParserBase::peek(&this->super_ParserBase,3), TVar12.kind == Identifier &&
          (TVar12 = ParserBase::peek(&this->super_ParserBase,4), TVar12.kind == OpenParenthesis))))
      {
        pFVar5 = (ForLoopStatementSyntax *)parseCheckerStatement(this,label,attributes);
        break;
      }
    case WAndKeyword:
    case WeakKeyword:
    case Weak0Keyword:
    case Weak1Keyword:
switchD_0068015f_caseD_67:
      TVar12 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar12.kind);
      if (bVar1) {
        expr = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)
                                       ((uint)allowSuperNew * 8 + 2),0);
        local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
        local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c8c880;
        TVar12 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        pFVar5 = (ForLoopStatementSyntax *)
                 slang::syntax::SyntaxFactory::expressionStatement
                           (&this->factory,label,&local_c0,expr,TVar12);
      }
      else {
        local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        SVar7 = Token::location((Token *)&local_c0);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x510005,SVar7);
        local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
        local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c8c880;
        local_40 = ParserBase::peek(&this->super_ParserBase);
        SVar7 = Token::location(&local_40);
        TVar12 = ParserBase::missingToken(&this->super_ParserBase,Semicolon,SVar7);
        pFVar5 = (ForLoopStatementSyntax *)
                 slang::syntax::SyntaxFactory::emptyStatement(&this->factory,label,&local_c0,TVar12)
        ;
      }
    }
  }
LAB_00680978:
  this->recursionDepth = this->recursionDepth - 1;
  return &pFVar5->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseStatement(bool allowEmpty, bool allowSuperNew) {
    auto dg = setDepthGuard();

    NamedLabelSyntax* label = nullptr;
    if (peek().kind == TokenKind::Identifier && peek(1).kind == TokenKind::Colon) {
        auto name = consume();
        label = &factory.namedLabel(name, consume());
    }

    auto attributes = parseAttributes();
    switch (peek().kind) {
        case TokenKind::UniqueKeyword:
        case TokenKind::Unique0Keyword:
        case TokenKind::PriorityKeyword: {
            switch (peek(1).kind) {
                case TokenKind::IfKeyword:
                    return parseConditionalStatement(label, attributes, consume());
                case TokenKind::CaseKeyword:
                case TokenKind::CaseXKeyword:
                case TokenKind::CaseZKeyword: {
                    auto modifier = consume();
                    return parseCaseStatement(label, attributes, modifier, consume());
                }
                default: {
                    addDiag(diag::ExpectedIfOrCase, peek(1).location())
                        << LexerFacts::getTokenKindText(peek().kind);
                    skipToken(std::nullopt);
                    return factory.emptyStatement(
                        label, attributes, missingToken(TokenKind::Semicolon, peek().location()));
                }
            }
        }
        case TokenKind::CaseKeyword:
        case TokenKind::CaseXKeyword:
        case TokenKind::CaseZKeyword:
            return parseCaseStatement(label, attributes, Token(), consume());
        case TokenKind::IfKeyword:
            return parseConditionalStatement(label, attributes, Token());
        case TokenKind::ForeverKeyword: {
            auto forever = consume();
            auto& body = parseStatement();
            checkEmptyBody(body, forever, "forever loop"sv);
            return factory.foreverStatement(label, attributes, forever, body);
        }
        case TokenKind::RepeatKeyword:
        case TokenKind::WhileKeyword:
            return parseLoopStatement(label, attributes);
        case TokenKind::DoKeyword:
            return parseDoWhileStatement(label, attributes);
        case TokenKind::ForKeyword:
            return parseForLoopStatement(label, attributes);
        case TokenKind::ForeachKeyword:
            return parseForeachLoopStatement(label, attributes);
        case TokenKind::ReturnKeyword:
            return parseReturnStatement(label, attributes);
        case TokenKind::BreakKeyword:
        case TokenKind::ContinueKeyword:
            return parseJumpStatement(label, attributes);
        case TokenKind::Hash:
        case TokenKind::DoubleHash:
        case TokenKind::At: {
            auto timingControl = parseTimingControl();
            SLANG_ASSERT(timingControl);
            return factory.timingControlStatement(label, attributes, *timingControl,
                                                  parseStatement());
        }
        case TokenKind::AssignKeyword:
            return parseProceduralAssignStatement(label, attributes,
                                                  SyntaxKind::ProceduralAssignStatement);
        case TokenKind::ForceKeyword:
            return parseProceduralAssignStatement(label, attributes,
                                                  SyntaxKind::ProceduralForceStatement);
        case TokenKind::DeassignKeyword:
            return parseProceduralDeassignStatement(label, attributes,
                                                    SyntaxKind::ProceduralDeassignStatement);
        case TokenKind::ReleaseKeyword:
            return parseProceduralDeassignStatement(label, attributes,
                                                    SyntaxKind::ProceduralReleaseStatement);
        case TokenKind::DisableKeyword:
            return parseDisableStatement(label, attributes);
        case TokenKind::BeginKeyword:
            return parseBlock(SyntaxKind::SequentialBlockStatement, TokenKind::EndKeyword, label,
                              attributes);
        case TokenKind::ForkKeyword:
            return parseBlock(SyntaxKind::ParallelBlockStatement, TokenKind::JoinKeyword, label,
                              attributes);
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword:
            return parseAssertionStatement(label, attributes);
        case TokenKind::RestrictKeyword:
        case TokenKind::ExpectKeyword:
            return parseConcurrentAssertion(label, attributes);
        case TokenKind::WaitKeyword:
            return parseWaitStatement(label, attributes);
        case TokenKind::WaitOrderKeyword:
            return parseWaitOrderStatement(label, attributes);
        case TokenKind::RandCaseKeyword:
            return parseRandCaseStatement(label, attributes);
        case TokenKind::RandSequenceKeyword:
            return parseRandSequenceStatement(label, attributes);
        case TokenKind::Semicolon:
            if (label)
                addDiag(diag::NoLabelOnSemicolon, peek().location());
            else if (!allowEmpty)
                addDiag(diag::ExpectedStatement, peek().location());
            return factory.emptyStatement(label, attributes, consume());
        case TokenKind::MinusArrow:
        case TokenKind::MinusDoubleArrow:
            return parseEventTriggerStatement(label, attributes);
        case TokenKind::VoidKeyword:
            return parseVoidCallStatement(label, attributes);
        case TokenKind::Identifier: {
            // This could be a checker instantiation.
            uint32_t index = 1;
            if (peek(index).kind == TokenKind::DoubleColon &&
                peek(index + 1).kind == TokenKind::Identifier) {
                index = 3;
            }

            if (peek(index).kind == TokenKind::Identifier &&
                peek(index + 1).kind == TokenKind::OpenParenthesis) {
                return parseCheckerStatement(label, attributes);
            }

            break;
        }
        case TokenKind::UnitSystemName:
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier &&
                peek(4).kind == TokenKind::OpenParenthesis) {
                return parseCheckerStatement(label, attributes);
            }
            break;
        default:
            break;
    }

    // everything else should be some kind of expression
    if (isPossibleExpression(peek().kind)) {
        bitmask<ExpressionOptions> options = ExpressionOptions::ProceduralAssignmentContext;
        if (allowSuperNew)
            options |= ExpressionOptions::AllowSuperNewCall;

        auto& expr = parseSubExpression(options, 0);
        return factory.expressionStatement(label, attributes, expr, expect(TokenKind::Semicolon));
    }

    addDiag(diag::ExpectedStatement, peek().location());
    return factory.emptyStatement(label, attributes,
                                  missingToken(TokenKind::Semicolon, peek().location()));
}